

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O2

rnndecaddrinfo *
trymatch(rnndeccontext *ctx,rnndelem **elems,int elemsnum,uint64_t addr,int write,int dwidth,
        uint64_t *indices,int indicesnum)

{
  rnnetype rVar1;
  uint64_t uVar2;
  rnndelem **pprVar3;
  envy_colors *peVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  char **ppcVar12;
  char **ppcVar13;
  rnndeccontext *prVar14;
  int iVar15;
  rnndecaddrinfo *prVar16;
  char *pcVar17;
  rnndelem *prVar18;
  uint64_t addr_00;
  ulong uVar19;
  ulong uVar20;
  undefined1 *puVar21;
  undefined4 in_register_0000008c;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auStack_88 [8];
  ulong local_80;
  long local_78;
  char *local_70;
  char *tmp;
  ulong local_60;
  undefined1 *local_58;
  rnndelem **local_50;
  char **local_48;
  rnndeccontext *local_40;
  char *local_38;
  char *name;
  
  lVar22 = CONCAT44(in_register_0000008c,dwidth);
  puVar21 = auStack_88;
  tmp = (char *)CONCAT44(tmp._4_4_,write);
  local_78 = (long)(int)indices;
  uVar25 = 0;
  if (0 < (int)indices) {
    uVar25 = (ulong)indices & 0xffffffff;
  }
  local_80 = (ulong)(uint)elemsnum;
  if (elemsnum < 1) {
    local_80 = 0;
  }
  local_60 = 0;
  local_50 = elems;
  local_48 = (char **)addr;
  local_40 = ctx;
  do {
    if (local_60 == local_80) {
      return (rnndecaddrinfo *)0x0;
    }
    prVar18 = local_50[local_60];
    *(undefined8 *)(puVar21 + -8) = 0x10772e;
    iVar15 = rnndec_varmatch(ctx,&prVar18->varinfo);
    if (iVar15 != 0) {
      prVar18 = local_50[local_60];
      rVar1 = prVar18->type;
      ctx = local_40;
      if (rVar1 == RNN_ETYPE_REG) {
        uVar24 = (long)local_48 - prVar18->offset;
        if (prVar18->offset <= local_48) {
          uVar19 = prVar18->stride;
          if (uVar19 == 0) {
            pcVar17 = (char *)0x0;
          }
          else {
            pcVar17 = (char *)(uVar24 / uVar19);
            uVar24 = uVar24 % uVar19;
          }
          if ((uVar24 < (ulong)(long)(prVar18->width / (int)tmp)) &&
             (pcVar17 <= (char *)(prVar18->length - 1))) {
            tmp = pcVar17;
            local_58 = (undefined1 *)CONCAT44(local_58._4_4_,prVar18->width);
            *(undefined8 *)(puVar21 + -8) = 0x18;
            sVar7 = *(size_t *)(puVar21 + -8);
            *(undefined8 *)(puVar21 + -8) = 1;
            sVar8 = *(size_t *)(puVar21 + -8);
            *(undefined8 *)(puVar21 + -8) = 0x107a68;
            prVar16 = (rnndecaddrinfo *)calloc(sVar7,sVar8);
            prVar16->typeinfo = &prVar18->typeinfo;
            prVar16->width = (int)local_58;
            pcVar17 = local_40->colors->reset;
            pcVar5 = local_40->colors->rname;
            pcVar6 = prVar18->name;
            local_48 = &prVar16->name;
            *(undefined8 *)(puVar21 + -8) = 0x107aa9;
            asprintf(&prVar16->name,"%s%s%s",pcVar5,pcVar6,pcVar17);
            ppcVar12 = local_48;
            uVar19 = 0;
            while (prVar14 = local_40, ppcVar13 = local_48, pcVar17 = tmp, uVar25 != uVar19) {
              pcVar17 = *ppcVar12;
              uVar2 = *(uint64_t *)(lVar22 + uVar19 * 8);
              local_58 = (undefined1 *)uVar19;
              *(undefined8 *)(puVar21 + -8) = 0x107ac8;
              pcVar17 = appendidx(prVar14,pcVar17,uVar2);
              *ppcVar12 = pcVar17;
              uVar19 = (long)local_58 + 1;
            }
            if (local_50[local_60]->length != 1) {
              pcVar5 = *local_48;
              *(undefined8 *)(puVar21 + -8) = 0x107afe;
              pcVar17 = appendidx(prVar14,pcVar5,(uint64_t)pcVar17);
              *ppcVar13 = pcVar17;
            }
            ppcVar12 = local_48;
            if (uVar24 == 0) {
              return prVar16;
            }
            pcVar17 = *local_48;
            pcVar5 = prVar14->colors->reset;
            pcVar6 = prVar14->colors->err;
            *(undefined8 *)(puVar21 + -8) = 0x107b34;
            asprintf(&local_70,"%s+%s%#lx%s",pcVar17,pcVar6,uVar24,pcVar5);
            pcVar17 = *ppcVar12;
            *(undefined8 *)(puVar21 + -8) = 0x107b3c;
            free(pcVar17);
            *ppcVar12 = local_70;
            return prVar16;
          }
        }
      }
      else if (rVar1 == RNN_ETYPE_ARRAY) {
        uVar24 = (long)local_48 - prVar18->offset;
        if (prVar18->offset <= local_48) {
          uVar19 = uVar24 / prVar18->stride;
          uVar24 = uVar24 % prVar18->stride;
          if (uVar19 <= prVar18->length - 1) {
            pcVar17 = local_40->colors->reset;
            pcVar5 = local_40->colors->rname;
            pcVar6 = prVar18->name;
            *(undefined8 *)(puVar21 + -8) = 0x1079a3;
            asprintf(&local_38,"%s%s%s",pcVar5,pcVar6,pcVar17);
            for (uVar20 = 0; pcVar17 = local_38, prVar14 = local_40, pprVar3 = local_50,
                uVar11 = local_60, uVar25 != uVar20; uVar20 = uVar20 + 1) {
              uVar2 = *(uint64_t *)(lVar22 + uVar20 * 8);
              *(undefined8 *)(puVar21 + -8) = 0x1079b9;
              local_38 = appendidx(prVar14,pcVar17,uVar2);
            }
            prVar18 = local_50[local_60];
            if (prVar18->length != 1) {
              *(undefined8 *)(puVar21 + -8) = 0x1079ee;
              local_38 = appendidx(prVar14,pcVar17,uVar19);
              prVar18 = pprVar3[uVar11];
            }
            pprVar3 = prVar18->subelems;
            iVar15 = prVar18->subelemsnum;
            *(undefined4 *)(puVar21 + -0x10) = 0;
            iVar10 = (int)tmp;
            *(undefined8 *)(puVar21 + -0x18) = 0x107a17;
            prVar16 = trymatch(prVar14,pprVar3,iVar15,uVar24,iVar10,0,
                               *(uint64_t **)(puVar21 + -0x10),*(int *)(puVar21 + -8));
            pcVar17 = local_38;
            if (prVar16 == (rnndecaddrinfo *)0x0) {
              *(undefined8 *)(puVar21 + -8) = 0x18;
              sVar7 = *(size_t *)(puVar21 + -8);
              *(undefined8 *)(puVar21 + -8) = 1;
              sVar8 = *(size_t *)(puVar21 + -8);
              *(undefined8 *)(puVar21 + -8) = 0x107b52;
              prVar16 = (rnndecaddrinfo *)calloc(sVar7,sVar8);
              pcVar6 = local_38;
              pcVar17 = prVar14->colors->reset;
              pcVar5 = prVar14->colors->err;
              *(undefined8 *)(puVar21 + -8) = 0x107b7c;
              asprintf(&local_70,"%s+%s%#lx%s",pcVar6,pcVar5,uVar24,pcVar17);
              pcVar17 = local_38;
            }
            else {
              pcVar5 = prVar16->name;
              *(undefined8 *)(puVar21 + -8) = 0x107a44;
              asprintf(&local_70,"%s.%s",pcVar17,pcVar5);
              pcVar17 = local_38;
              *(undefined8 *)(puVar21 + -8) = 0x107a4d;
              free(pcVar17);
              pcVar17 = prVar16->name;
            }
            *(undefined8 *)(puVar21 + -8) = 0x107b85;
            free(pcVar17);
            prVar16->name = local_70;
            return prVar16;
          }
        }
      }
      else if (rVar1 == RNN_ETYPE_STRIPE) {
        for (uVar24 = 0;
            (prVar14 = local_40, uVar2 = prVar18->length, ctx = local_40, uVar24 <= uVar2 - 1 &&
            (uVar19 = prVar18->stride * uVar24 + prVar18->offset, addr_00 = (long)local_48 - uVar19,
            uVar19 <= local_48)); uVar24 = uVar24 + 1) {
          local_58 = puVar21;
          uVar9 = (uint)(uVar2 != 1) + (int)indices;
          if (prVar18->name != (char *)0x0) {
            uVar9 = 0;
          }
          lVar23 = (long)puVar21 - ((ulong)uVar9 * 8 + 0xf & 0xfffffffffffffff0);
          prVar18 = local_50[local_60];
          if (prVar18->name == (char *)0x0) {
            for (uVar19 = 0; uVar25 != uVar19; uVar19 = uVar19 + 1) {
              *(undefined8 *)(lVar23 + uVar19 * 8) = *(undefined8 *)(lVar22 + uVar19 * 8);
            }
            if (uVar2 != 1) {
              *(ulong *)(lVar23 + local_78 * 8) = uVar24;
            }
          }
          pprVar3 = prVar18->subelems;
          iVar15 = prVar18->subelemsnum;
          iVar10 = (int)tmp;
          *(ulong *)(lVar23 + -0x10) = (ulong)uVar9;
          *(undefined8 *)(lVar23 + -0x18) = 0x10780b;
          prVar16 = trymatch(prVar14,pprVar3,iVar15,addr_00,iVar10,(int)lVar23,
                             *(uint64_t **)(lVar23 + -0x10),*(int *)(lVar23 + -8));
          if (prVar16 != (rnndecaddrinfo *)0x0) {
            pcVar17 = local_50[local_60]->name;
            if (pcVar17 == (char *)0x0) {
              return prVar16;
            }
            peVar4 = prVar14->colors;
            pcVar5 = peVar4->reset;
            pcVar6 = peVar4->rname;
            *(undefined8 *)(lVar23 + -8) = 0x1078e0;
            asprintf(&local_38,"%s%s%s",pcVar6,pcVar17,pcVar5);
            for (uVar19 = 0; pcVar17 = local_38, prVar14 = local_40, uVar25 != uVar19;
                uVar19 = uVar19 + 1) {
              uVar2 = *(uint64_t *)(lVar22 + uVar19 * 8);
              *(undefined8 *)(lVar23 + -8) = 0x1078f6;
              local_38 = appendidx(prVar14,pcVar17,uVar2);
            }
            if (local_50[local_60]->length != 1) {
              *(undefined8 *)(lVar23 + -8) = 0x10792a;
              local_38 = appendidx(prVar14,pcVar17,uVar24);
            }
            pcVar5 = local_38;
            pcVar17 = prVar16->name;
            *(undefined8 *)(lVar23 + -8) = 0x10794a;
            asprintf(&local_70,"%s.%s",pcVar5,pcVar17);
            pcVar17 = local_38;
            *(undefined8 *)(lVar23 + -8) = 0x107953;
            free(pcVar17);
            pcVar17 = prVar16->name;
            *(undefined8 *)(lVar23 + -8) = 0x10795c;
            free(pcVar17);
            prVar16->name = local_70;
            return prVar16;
          }
          prVar18 = local_50[local_60];
          puVar21 = local_58;
        }
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

static struct rnndecaddrinfo *trymatch (struct rnndeccontext *ctx, struct rnndelem **elems, int elemsnum, uint64_t addr, int write, int dwidth, uint64_t *indices, int indicesnum) {
	struct rnndecaddrinfo *res;
	int i, j;
	for (i = 0; i < elemsnum; i++) {
		if (!rnndec_varmatch(ctx, &elems[i]->varinfo))
			continue;
		uint64_t offset, idx;
		char *tmp, *name;
		switch (elems[i]->type) {
			case RNN_ETYPE_REG:
				if (addr < elems[i]->offset)
					break;
				if (elems[i]->stride) {
					idx = (addr-elems[i]->offset)/elems[i]->stride;
					offset = (addr-elems[i]->offset)%elems[i]->stride;
				} else {
					idx = 0;
					offset = addr-elems[i]->offset;
				}
				if (offset >= elems[i]->width/dwidth)
					break;
				if (elems[i]->length && idx >= elems[i]->length)
					break;
				res = calloc (sizeof *res, 1);
				res->typeinfo = &elems[i]->typeinfo;
				res->width = elems[i]->width;
				asprintf (&res->name, "%s%s%s", ctx->colors->rname, elems[i]->name, ctx->colors->reset);
				for (j = 0; j < indicesnum; j++)
					res->name = appendidx(ctx, res->name, indices[j]);
				if (elems[i]->length != 1)
					res->name = appendidx(ctx, res->name, idx);
				if (offset) {
					asprintf (&tmp, "%s+%s%#"PRIx64"%s", res->name, ctx->colors->err, offset, ctx->colors->reset);
					free(res->name);
					res->name = tmp;
				}
				return res;
			case RNN_ETYPE_STRIPE:
				for (idx = 0; idx < elems[i]->length || !elems[i]->length; idx++) {
					if (addr < elems[i]->offset + elems[i]->stride * idx)
						break;
					offset = addr - (elems[i]->offset + elems[i]->stride * idx);
					int extraidx = (elems[i]->length != 1);
					int nindnum = (elems[i]->name ? 0 : indicesnum + extraidx);
					uint64_t nind[nindnum];
					if (!elems[i]->name) {
						for (j = 0; j < indicesnum; j++)
							nind[j] = indices[j];
						if (extraidx)
							nind[indicesnum] = idx;
					}
					res = trymatch (ctx, elems[i]->subelems, elems[i]->subelemsnum, offset, write, dwidth, nind, nindnum);
					if (!res)
						continue;
					if (!elems[i]->name)
						return res;
					asprintf (&name, "%s%s%s", ctx->colors->rname, elems[i]->name, ctx->colors->reset);
					for (j = 0; j < indicesnum; j++)
						name = appendidx(ctx, name, indices[j]);
					if (elems[i]->length != 1)
						name = appendidx(ctx, name, idx);
					asprintf (&tmp, "%s.%s", name, res->name);
					free(name);
					free(res->name);
					res->name = tmp;
					return res;
				}
				break;
			case RNN_ETYPE_ARRAY:
				if (addr < elems[i]->offset)
					break;
				idx = (addr-elems[i]->offset)/elems[i]->stride;
				offset = (addr-elems[i]->offset)%elems[i]->stride;
				if (elems[i]->length && idx >= elems[i]->length)
					break;
				asprintf (&name, "%s%s%s", ctx->colors->rname, elems[i]->name, ctx->colors->reset);
				for (j = 0; j < indicesnum; j++)
					name = appendidx(ctx, name, indices[j]);
				if (elems[i]->length != 1)
					name = appendidx(ctx, name, idx);
				if ((res = trymatch (ctx, elems[i]->subelems, elems[i]->subelemsnum, offset, write, dwidth, 0, 0))) {
					asprintf (&tmp, "%s.%s", name, res->name);
					free(name);
					free(res->name);
					res->name = tmp;
					return res;
				}
				res = calloc (sizeof *res, 1);
				asprintf (&tmp, "%s+%s%#"PRIx64"%s", name, ctx->colors->err, offset, ctx->colors->reset);
				free(name);
				res->name = tmp;
				return res;
			default:
				break;
		}
	}
	return 0;
}